

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene_curves.cpp
# Opt level: O2

BBox3fa * __thiscall
embree::avx512::
CurveGeometryISA<(embree::Geometry::GType)2,_embree::avx512::HermiteCurveGeometryInterface,_embree::HermiteCurveT>
::vbounds(BBox3fa *__return_storage_ptr__,
         CurveGeometryISA<(embree::Geometry::GType)2,_embree::avx512::HermiteCurveGeometryInterface,_embree::HermiteCurveT>
         *this,Vec3fa *ofs,float scale,float r_scale0,LinearSpace3fa *space,size_t i,size_t itime)

{
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar1;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar2;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar3;
  uint uVar4;
  BufferView<embree::Vec3fa> *pBVar5;
  char *pcVar6;
  size_t sVar7;
  BufferView<embree::Vec3fx> *pBVar8;
  char *pcVar9;
  char *pcVar10;
  undefined1 auVar11 [32];
  ulong uVar12;
  long lVar13;
  long lVar14;
  ulong uVar15;
  long lVar16;
  long lVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 in_YmmResult [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar63 [16];
  undefined4 uVar62;
  undefined1 in_register_00001204 [60];
  undefined1 auVar64 [64];
  float fVar65;
  float fVar66;
  float fVar67;
  float fVar68;
  float fVar69;
  vfloat4 a0;
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  vfloat4 b1;
  undefined1 auVar72 [32];
  undefined1 auVar73 [16];
  undefined1 auVar74 [32];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 in_ZMM21 [64];
  
  auVar64._4_60_ = in_register_00001204;
  auVar64._0_4_ = scale;
  uVar4 = *(uint *)(*(long *)&(this->super_HermiteCurveGeometryInterface<embree::HermiteCurveT>).
                              super_CurveGeometry.super_Geometry.field_0x58 +
                   i * *(long *)&(this->super_HermiteCurveGeometryInterface<embree::HermiteCurveT>).
                                 super_CurveGeometry.field_0x68);
  uVar12 = (ulong)uVar4;
  uVar15 = (ulong)(uVar4 + 1);
  pBVar5 = (this->super_HermiteCurveGeometryInterface<embree::HermiteCurveT>).super_CurveGeometry.
           normals.items;
  pcVar6 = pBVar5[itime].super_RawBufferView.ptr_ofs;
  sVar7 = pBVar5[itime].super_RawBufferView.stride;
  auVar41 = *(undefined1 (*) [16])(pcVar6 + sVar7 * uVar12);
  auVar38 = *(undefined1 (*) [16])(pcVar6 + sVar7 * uVar15);
  pBVar8 = (this->super_HermiteCurveGeometryInterface<embree::HermiteCurveT>).super_CurveGeometry.
           tangents.items;
  pcVar6 = pBVar8[itime].super_RawBufferView.ptr_ofs;
  sVar7 = pBVar8[itime].super_RawBufferView.stride;
  lVar13 = sVar7 * uVar12;
  fVar65 = (this->super_HermiteCurveGeometryInterface<embree::HermiteCurveT>).super_CurveGeometry.
           maxRadiusScale;
  pBVar8 = (this->super_HermiteCurveGeometryInterface<embree::HermiteCurveT>).super_CurveGeometry.
           vertices.items;
  lVar16 = sVar7 * uVar15;
  pcVar9 = pBVar8[itime].super_RawBufferView.ptr_ofs;
  sVar7 = pBVar8[itime].super_RawBufferView.stride;
  lVar14 = sVar7 * uVar12;
  lVar17 = sVar7 * uVar15;
  pBVar5 = (this->super_HermiteCurveGeometryInterface<embree::HermiteCurveT>).super_CurveGeometry.
           dnormals.items;
  pcVar10 = pBVar5[itime].super_RawBufferView.ptr_ofs;
  sVar7 = pBVar5[itime].super_RawBufferView.stride;
  auVar44._16_16_ = in_YmmResult._16_16_;
  auVar37 = vinsertps_avx(*(undefined1 (*) [16])(pcVar9 + lVar14),
                          ZEXT416((uint)(fVar65 * *(float *)(pcVar9 + lVar14 + 0xc))),0x30);
  auVar35 = vinsertps_avx(*(undefined1 (*) [16])(pcVar6 + lVar13),
                          ZEXT416((uint)(fVar65 * *(float *)(pcVar6 + lVar13 + 0xc))),0x30);
  auVar75._8_4_ = 0xbeaaaaab;
  auVar75._0_8_ = 0xbeaaaaabbeaaaaab;
  auVar75._12_4_ = 0xbeaaaaab;
  auVar40 = vfnmadd213ps_fma(auVar35,auVar75,auVar37);
  auVar35 = vinsertps_avx512f(*(undefined1 (*) [16])(pcVar6 + lVar16),
                              ZEXT416((uint)(fVar65 * *(float *)(pcVar6 + lVar16 + 0xc))),0x30);
  auVar36 = vinsertps_avx512f(*(undefined1 (*) [16])(pcVar9 + lVar17),
                              ZEXT416((uint)(fVar65 * *(float *)(pcVar9 + lVar17 + 0xc))),0x30);
  auVar18 = vfmadd213ps_avx512vl(auVar35,auVar75,auVar36);
  auVar19 = vfnmadd132ps_avx512vl(*(undefined1 (*) [16])(pcVar10 + uVar12 * sVar7),auVar41,auVar75);
  auVar39 = vfmadd132ps_fma(auVar75,auVar38,*(undefined1 (*) [16])(pcVar10 + sVar7 * uVar15));
  aVar1 = ofs->field_0;
  aVar2 = (space->vx).field_0;
  aVar3 = (space->vy).field_0;
  auVar35 = *(undefined1 (*) [16])(space->vz).field_0.m128;
  auVar44._0_16_ = vxorps_avx512vl(in_ZMM21._0_16_,in_ZMM21._0_16_);
  auVar20 = vmulps_avx512vl(auVar36,auVar44._0_16_);
  auVar20 = vfmadd231ps_avx512vl(auVar20,auVar18,auVar44._0_16_);
  auVar28 = vfmadd213ps_fma(ZEXT816(0) << 0x40,auVar40,auVar20);
  auVar21 = vmulps_avx512vl(auVar38,auVar44._0_16_);
  auVar22 = vfmadd231ps_avx512vl(auVar21,auVar39,auVar44._0_16_);
  auVar21 = vfmadd213ps_avx512vl(ZEXT816(0),auVar19,auVar22);
  auVar23 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
  auVar26._0_4_ = auVar41._0_4_ + auVar21._0_4_;
  auVar26._4_4_ = auVar41._4_4_ + auVar21._4_4_;
  auVar26._8_4_ = auVar41._8_4_ + auVar21._8_4_;
  auVar26._12_4_ = auVar41._12_4_ + auVar21._12_4_;
  auVar20 = vfmadd231ps_avx512vl(auVar20,auVar40,auVar23);
  auVar24 = vfnmadd231ps_avx512vl(auVar20,auVar37,auVar23);
  auVar25 = vshufps_avx512vl(auVar24,auVar24,0xc9);
  auVar20 = vshufps_avx(auVar26,auVar26,0xc9);
  auVar30._0_4_ = auVar24._0_4_ * auVar20._0_4_;
  auVar30._4_4_ = auVar24._4_4_ * auVar20._4_4_;
  auVar30._8_4_ = auVar24._8_4_ * auVar20._8_4_;
  auVar30._12_4_ = auVar24._12_4_ * auVar20._12_4_;
  auVar20 = vfmsub231ps_avx512vl(auVar30,auVar25,auVar26);
  auVar21 = vshufps_avx(auVar20,auVar20,0xc9);
  auVar20 = vdpps_avx(auVar21,auVar21,0x7f);
  auVar26 = vbroadcastss_avx512vl(auVar64._0_16_);
  auVar63._0_4_ = auVar28._0_4_ + auVar37._0_4_;
  auVar63._4_4_ = auVar28._4_4_ + auVar37._4_4_;
  auVar63._8_4_ = auVar28._8_4_ + auVar37._8_4_;
  auVar63._12_4_ = auVar28._12_4_ + auVar37._12_4_;
  auVar27 = vshufps_avx512vl(auVar63,auVar63,0xff);
  fVar66 = auVar20._0_4_;
  auVar46._4_28_ = auVar44._4_28_;
  auVar46._0_4_ = fVar66;
  auVar28 = vrsqrt14ss_avx512f(auVar44._0_16_,auVar46._0_16_);
  auVar29 = vmulss_avx512f(auVar28,ZEXT416(0x3fc00000));
  auVar30 = vmulss_avx512f(auVar20,ZEXT416(0x3f000000));
  auVar30 = vmulss_avx512f(auVar30,auVar28);
  auVar28 = vmulss_avx512f(auVar30,ZEXT416((uint)(auVar28._0_4_ * auVar28._0_4_)));
  auVar28 = vsubss_avx512f(auVar29,auVar28);
  auVar29 = vbroadcastss_avx512vl(auVar28);
  auVar28 = vmulps_avx512vl(auVar21,auVar29);
  auVar30 = vmulps_avx512vl(auVar27,auVar28);
  auVar31 = vaddps_avx512vl(auVar63,auVar30);
  auVar32 = vsubps_avx512vl(auVar31,(undefined1  [16])aVar1);
  auVar32 = vmulps_avx512vl(auVar26,auVar32);
  auVar33 = vshufps_avx512vl(auVar32,auVar32,0xaa);
  auVar33 = vmulps_avx512vl(auVar35,auVar33);
  auVar34 = vshufps_avx512vl(auVar32,auVar32,0x55);
  auVar33 = vfmadd231ps_avx512vl(auVar33,(undefined1  [16])aVar3,auVar34);
  auVar32 = vbroadcastss_avx512vl(auVar32);
  auVar32 = vfmadd231ps_avx512vl(auVar33,(undefined1  [16])aVar2,auVar32);
  auVar33 = vshufps_avx512vl(auVar24,auVar24,0xff);
  auVar33 = vmulps_avx512vl(auVar33,auVar28);
  auVar28 = vfmadd231ps_avx512vl(auVar22,auVar19,auVar23);
  auVar22 = vfnmadd231ps_avx512vl(auVar28,auVar41,auVar23);
  auVar28 = vshufps_avx(auVar22,auVar22,0xc9);
  auVar28 = vmulps_avx512vl(auVar24,auVar28);
  auVar28 = vfmsub231ps_avx512vl(auVar28,auVar25,auVar22);
  auVar22 = vrcp14ss_avx512f(auVar44._0_16_,auVar46._0_16_);
  auVar20 = vfnmadd213ss_avx512f(auVar20,auVar22,ZEXT416(0x40000000));
  fVar65 = auVar20._0_4_ * auVar22._0_4_;
  auVar20 = vshufps_avx512vl(auVar28,auVar28,0xc9);
  auVar28._0_4_ = auVar20._0_4_ * fVar66;
  auVar28._4_4_ = auVar20._4_4_ * fVar66;
  auVar28._8_4_ = auVar20._8_4_ * fVar66;
  auVar28._12_4_ = auVar20._12_4_ * fVar66;
  auVar20 = vdpps_avx(auVar21,auVar20,0x7f);
  auVar34._0_4_ = auVar20._0_4_;
  auVar34._4_4_ = auVar34._0_4_;
  auVar34._8_4_ = auVar34._0_4_;
  auVar34._12_4_ = auVar34._0_4_;
  auVar20 = vmulps_avx512vl(auVar34,auVar21);
  auVar20 = vsubps_avx512vl(auVar28,auVar20);
  auVar21._0_4_ = fVar65 * auVar20._0_4_;
  auVar21._4_4_ = fVar65 * auVar20._4_4_;
  auVar21._8_4_ = fVar65 * auVar20._8_4_;
  auVar21._12_4_ = fVar65 * auVar20._12_4_;
  auVar20 = vmulps_avx512vl(auVar29,auVar21);
  auVar20 = vmulps_avx512vl(auVar27,auVar20);
  auVar28 = vaddps_avx512vl(auVar33,auVar20);
  auVar20._0_4_ = (auVar24._0_4_ + auVar28._0_4_) * 0.33333334;
  auVar20._4_4_ = (auVar24._4_4_ + auVar28._4_4_) * 0.33333334;
  auVar20._8_4_ = (auVar24._8_4_ + auVar28._8_4_) * 0.33333334;
  auVar20._12_4_ = (auVar24._12_4_ + auVar28._12_4_) * 0.33333334;
  auVar20 = vaddps_avx512vl(auVar31,auVar20);
  auVar20 = vsubps_avx(auVar20,(undefined1  [16])aVar1);
  auVar20 = vmulps_avx512vl(auVar26,auVar20);
  auVar21 = vbroadcastss_avx512vl(auVar20);
  auVar22 = vshufps_avx512vl(auVar20,auVar20,0x55);
  auVar20 = vshufps_avx(auVar20,auVar20,0xaa);
  fVar66 = auVar35._0_4_;
  auVar25._0_4_ = fVar66 * auVar20._0_4_;
  fVar67 = auVar35._4_4_;
  auVar25._4_4_ = fVar67 * auVar20._4_4_;
  fVar68 = auVar35._8_4_;
  auVar25._8_4_ = fVar68 * auVar20._8_4_;
  fVar69 = auVar35._12_4_;
  auVar25._12_4_ = fVar69 * auVar20._12_4_;
  auVar35 = vfmadd231ps_avx512vl(auVar25,(undefined1  [16])aVar3,auVar22);
  auVar22 = vfmadd231ps_avx512vl(auVar35,(undefined1  [16])aVar2,auVar21);
  auVar35 = vxorps_avx512vl(auVar21,auVar21);
  auVar35 = vfmadd213ps_avx512vl(auVar35,auVar18,auVar36);
  auVar35 = vfmadd231ps_avx512vl(auVar35,auVar40,auVar44._0_16_);
  auVar25 = vfmadd231ps_avx512vl(auVar35,auVar37,auVar44._0_16_);
  auVar35 = vfmadd213ps_fma(ZEXT816(0) << 0x20,auVar39,auVar38);
  auVar35 = vfmadd231ps_avx512vl(auVar35,auVar19,auVar44._0_16_);
  auVar20 = vfmadd231ps_avx512vl(auVar35,auVar41,auVar44._0_16_);
  auVar35 = vmulps_avx512vl(auVar36,auVar23);
  auVar35 = vfnmadd231ps_avx512vl(auVar35,auVar23,auVar18);
  auVar35 = vfmadd231ps_avx512vl(auVar35,auVar44._0_16_,auVar40);
  auVar36 = vfnmadd231ps_avx512vl(auVar35,auVar44._0_16_,auVar37);
  auVar37 = vshufps_avx512vl(auVar36,auVar36,0xc9);
  auVar35 = vshufps_avx(auVar20,auVar20,0xc9);
  auVar35 = vmulps_avx512vl(auVar36,auVar35);
  auVar35 = vfmsub231ps_avx512vl(auVar35,auVar37,auVar20);
  auVar20 = vshufps_avx(auVar35,auVar35,0xc9);
  auVar35 = vdpps_avx(auVar20,auVar20,0x7f);
  auVar48._16_16_ = bezier_basis0._6272_16_;
  auVar38 = vmulps_avx512vl(auVar38,auVar23);
  auVar38 = vfnmadd231ps_avx512vl(auVar38,auVar23,auVar39);
  fVar65 = auVar35._0_4_;
  auVar48._0_16_ = auVar44._0_16_;
  auVar49._4_28_ = auVar48._4_28_;
  auVar49._0_4_ = fVar65;
  auVar21 = vrsqrt14ss_avx512f(auVar44._0_16_,auVar49._0_16_);
  auVar39 = vmulss_avx512f(auVar21,ZEXT416(0x3fc00000));
  auVar40 = vmulss_avx512f(auVar35,ZEXT416(0x3f000000));
  auVar40 = vmulss_avx512f(auVar40,auVar21);
  auVar21 = vmulss_avx512f(auVar21,auVar21);
  auVar21 = vmulss_avx512f(auVar40,auVar21);
  auVar21 = vsubss_avx512f(auVar39,auVar21);
  auVar60._8_4_ = 2;
  auVar60._0_8_ = 0x200000002;
  auVar60._12_4_ = 2;
  auVar60._16_4_ = 2;
  auVar60._20_4_ = 2;
  auVar60._24_4_ = 2;
  auVar60._28_4_ = 2;
  auVar38 = vfmadd231ps_avx512vl(auVar38,auVar44._0_16_,auVar19);
  auVar38 = vfnmadd231ps_avx512vl(auVar38,auVar44._0_16_,auVar41);
  auVar41 = vshufps_avx(auVar38,auVar38,0xc9);
  auVar41 = vmulps_avx512vl(auVar36,auVar41);
  auVar41 = vfmsub231ps_avx512vl(auVar41,auVar37,auVar38);
  auVar41 = vshufps_avx(auVar41,auVar41,0xc9);
  auVar33._0_4_ = fVar65 * auVar41._0_4_;
  auVar33._4_4_ = fVar65 * auVar41._4_4_;
  auVar33._8_4_ = fVar65 * auVar41._8_4_;
  auVar33._12_4_ = fVar65 * auVar41._12_4_;
  auVar41 = vdpps_avx(auVar20,auVar41,0x7f);
  auVar42 = vpermps_avx512vl(auVar60,ZEXT1632(auVar32));
  fVar65 = auVar41._0_4_;
  auVar27._0_4_ = fVar65 * auVar20._0_4_;
  auVar27._4_4_ = fVar65 * auVar20._4_4_;
  auVar27._8_4_ = fVar65 * auVar20._8_4_;
  auVar27._12_4_ = fVar65 * auVar20._12_4_;
  auVar41 = vsubps_avx(auVar33,auVar27);
  auVar43 = vpermps_avx512vl(auVar60,ZEXT1632(auVar22));
  auVar38 = vrcp14ss_avx512f(auVar44._0_16_,auVar49._0_16_);
  auVar37 = vshufps_avx512vl(auVar25,auVar25,0xff);
  auVar21 = vbroadcastss_avx512vl(auVar21);
  auVar20 = vmulps_avx512vl(auVar20,auVar21);
  auVar35 = vfnmadd213ss_avx512f(auVar35,auVar38,ZEXT416(0x40000000));
  auVar39 = vshufps_avx512vl(auVar36,auVar36,0xff);
  auVar39 = vmulps_avx512vl(auVar39,auVar20);
  auVar20 = vmulps_avx512vl(auVar37,auVar20);
  fVar65 = auVar38._0_4_ * auVar35._0_4_;
  auVar35 = vaddps_avx512vl(auVar25,auVar20);
  auVar38._0_4_ = auVar41._0_4_ * fVar65;
  auVar38._4_4_ = auVar41._4_4_ * fVar65;
  auVar38._8_4_ = auVar41._8_4_ * fVar65;
  auVar38._12_4_ = auVar41._12_4_ * fVar65;
  auVar41 = vmulps_avx512vl(auVar21,auVar38);
  auVar41 = vmulps_avx512vl(auVar37,auVar41);
  auVar39 = vaddps_avx512vl(auVar39,auVar41);
  auVar41 = vaddps_avx512vl(auVar36,auVar39);
  auVar37._0_4_ = auVar41._0_4_ * 0.33333334;
  auVar37._4_4_ = auVar41._4_4_ * 0.33333334;
  auVar37._8_4_ = auVar41._8_4_ * 0.33333334;
  auVar37._12_4_ = auVar41._12_4_ * 0.33333334;
  auVar41 = vsubps_avx(auVar35,auVar37);
  auVar41 = vsubps_avx(auVar41,(undefined1  [16])aVar1);
  auVar41 = vmulps_avx512vl(auVar26,auVar41);
  uVar62 = auVar41._0_4_;
  auVar29._4_4_ = uVar62;
  auVar29._0_4_ = uVar62;
  auVar29._8_4_ = uVar62;
  auVar29._12_4_ = uVar62;
  auVar38 = vshufps_avx512vl(auVar41,auVar41,0x55);
  auVar41 = vshufps_avx(auVar41,auVar41,0xaa);
  auVar18._0_4_ = fVar66 * auVar41._0_4_;
  auVar18._4_4_ = fVar67 * auVar41._4_4_;
  auVar18._8_4_ = fVar68 * auVar41._8_4_;
  auVar18._12_4_ = fVar69 * auVar41._12_4_;
  auVar41 = vfmadd231ps_avx512vl(auVar18,(undefined1  [16])aVar3,auVar38);
  auVar38 = vfmadd231ps_fma(auVar41,(undefined1  [16])aVar2,auVar29);
  auVar46 = vpermps_avx2(auVar60,ZEXT1632(auVar38));
  auVar41 = vsubps_avx(auVar35,(undefined1  [16])aVar1);
  auVar41 = vmulps_avx512vl(auVar26,auVar41);
  auVar35 = vbroadcastss_avx512vl(auVar41);
  auVar37 = vshufps_avx512vl(auVar41,auVar41,0x55);
  auVar41 = vshufps_avx(auVar41,auVar41,0xaa);
  auVar40._0_4_ = fVar66 * auVar41._0_4_;
  auVar40._4_4_ = fVar67 * auVar41._4_4_;
  auVar40._8_4_ = fVar68 * auVar41._8_4_;
  auVar40._12_4_ = fVar69 * auVar41._12_4_;
  auVar41 = vfmadd231ps_avx512vl(auVar40,(undefined1  [16])aVar3,auVar37);
  auVar35 = vfmadd231ps_avx512vl(auVar41,(undefined1  [16])aVar2,auVar35);
  auVar44 = vpermps_avx512vl(auVar60,ZEXT1632(auVar35));
  auVar45 = vmulps_avx512vl(auVar44,bezier_basis0._3944_32_);
  auVar58._8_8_ = bezier_basis0._2796_8_;
  auVar58._0_8_ = bezier_basis0._2788_8_;
  auVar58._16_8_ = bezier_basis0._2804_8_;
  auVar58._24_8_ = bezier_basis0._2812_8_;
  auVar45 = vfmadd231ps_avx512vl(auVar45,auVar58,auVar46);
  auVar11._8_8_ = bezier_basis0._1640_8_;
  auVar11._0_8_ = bezier_basis0._1632_8_;
  auVar11._16_8_ = bezier_basis0._1648_8_;
  auVar11._24_8_ = bezier_basis0._1656_8_;
  auVar45 = vfmadd231ps_avx512vl(auVar45,auVar11,auVar43);
  auVar54._8_8_ = bezier_basis0._484_8_;
  auVar54._0_8_ = bezier_basis0._476_8_;
  auVar54._16_8_ = bezier_basis0._492_8_;
  auVar54._24_8_ = bezier_basis0._500_8_;
  auVar45 = vfmadd231ps_avx512vl(auVar45,auVar54,auVar42);
  auVar44 = vmulps_avx512vl(auVar44,bezier_basis0._8568_32_);
  auVar46 = vfmadd231ps_avx512vl(auVar44,bezier_basis0._7412_32_,auVar46);
  auVar46 = vfmadd231ps_avx512vl(auVar46,bezier_basis0._6256_32_,auVar43);
  auVar43._8_8_ = bezier_basis0._5108_8_;
  auVar43._0_8_ = bezier_basis0._5100_8_;
  auVar43._16_8_ = bezier_basis0._5116_8_;
  auVar43._24_8_ = bezier_basis0._5124_8_;
  auVar46 = vfmadd231ps_avx512vl(auVar46,auVar43,auVar42);
  auVar50._8_4_ = 0x3d638e39;
  auVar50._0_8_ = 0x3d638e393d638e39;
  auVar50._12_4_ = 0x3d638e39;
  auVar50._16_4_ = 0x3d638e39;
  auVar50._20_4_ = 0x3d638e39;
  auVar50._24_4_ = 0x3d638e39;
  auVar50._28_4_ = 0x3d638e39;
  auVar44 = vmulps_avx512vl(auVar46,auVar50);
  auVar46 = vblendps_avx(auVar44,ZEXT832(0) << 0x20,1);
  auVar47 = vsubps_avx512vl(auVar45,auVar46);
  auVar46 = vblendps_avx(auVar44,ZEXT832(0) << 0x20,0x80);
  auVar48 = vaddps_avx512vl(auVar45,auVar46);
  auVar61._8_4_ = 0xff800000;
  auVar61._0_8_ = 0xff800000ff800000;
  auVar61._12_4_ = 0xff800000;
  auVar61._16_4_ = 0xff800000;
  auVar61._20_4_ = 0xff800000;
  auVar61._24_4_ = 0xff800000;
  auVar61._28_4_ = 0xff800000;
  auVar46 = vmaxps_avx512vl(auVar61,auVar45);
  auVar44 = vmaxps_avx512vl(auVar47,auVar48);
  auVar44 = vmaxps_avx(auVar46,auVar44);
  auVar49 = vbroadcastss_avx512vl(ZEXT416(1));
  auVar46 = vpermps_avx512vl(auVar49,ZEXT1632(auVar38));
  auVar42 = vpermps_avx512vl(auVar49,ZEXT1632(auVar35));
  auVar50 = vmulps_avx512vl(auVar42,bezier_basis0._3944_32_);
  auVar50 = vfmadd231ps_avx512vl(auVar50,auVar58,auVar46);
  auVar42 = vmulps_avx512vl(auVar42,bezier_basis0._8568_32_);
  auVar46 = vfmadd231ps_avx512vl(auVar42,bezier_basis0._7412_32_,auVar46);
  auVar42 = vpermps_avx512vl(auVar49,ZEXT1632(auVar22));
  auVar50 = vfmadd231ps_avx512vl(auVar50,auVar11,auVar42);
  auVar46 = vfmadd231ps_avx512vl(auVar46,bezier_basis0._6256_32_,auVar42);
  auVar42 = vpermps_avx512vl(auVar49,ZEXT1632(auVar32));
  auVar50 = vfmadd231ps_avx512vl(auVar50,auVar54,auVar42);
  auVar41 = vfmadd231ps_fma(auVar46,auVar43,auVar42);
  auVar42._28_4_ = auVar42._28_4_;
  auVar42._0_28_ =
       ZEXT1628(CONCAT412(auVar41._12_4_ * 0.055555556,
                          CONCAT48(auVar41._8_4_ * 0.055555556,
                                   CONCAT44(auVar41._4_4_ * 0.055555556,auVar41._0_4_ * 0.055555556)
                                  )));
  auVar46 = vblendps_avx(auVar42,ZEXT832(0) << 0x20,1);
  auVar51 = vsubps_avx512vl(auVar50,auVar46);
  auVar46 = vblendps_avx(auVar42,ZEXT832(0) << 0x20,0x80);
  auVar52 = vaddps_avx512vl(auVar50,auVar46);
  auVar46 = vmaxps_avx512vl(auVar61,auVar50);
  auVar42 = vmaxps_avx512vl(auVar51,auVar52);
  auVar42 = vmaxps_avx(auVar46,auVar42);
  auVar55._0_4_ = auVar38._0_4_;
  auVar55._4_4_ = auVar55._0_4_;
  auVar55._8_4_ = auVar55._0_4_;
  auVar55._12_4_ = auVar55._0_4_;
  auVar55._16_4_ = auVar55._0_4_;
  auVar55._20_4_ = auVar55._0_4_;
  auVar55._24_4_ = auVar55._0_4_;
  auVar55._28_4_ = auVar55._0_4_;
  auVar53._0_4_ = auVar35._0_4_;
  auVar53._4_4_ = auVar53._0_4_;
  auVar53._8_4_ = auVar53._0_4_;
  auVar53._12_4_ = auVar53._0_4_;
  auVar53._16_4_ = auVar53._0_4_;
  auVar53._20_4_ = auVar53._0_4_;
  auVar53._24_4_ = auVar53._0_4_;
  auVar53._28_4_ = auVar53._0_4_;
  auVar46 = vmulps_avx512vl(auVar53,bezier_basis0._3944_32_);
  auVar41 = vfmadd231ps_fma(auVar46,auVar58,auVar55);
  auVar46 = vmulps_avx512vl(auVar53,bezier_basis0._8568_32_);
  auVar46 = vfmadd231ps_avx512vl(auVar46,bezier_basis0._7412_32_,auVar55);
  uVar62 = auVar22._0_4_;
  auVar56._4_4_ = uVar62;
  auVar56._0_4_ = uVar62;
  auVar56._8_4_ = uVar62;
  auVar56._12_4_ = uVar62;
  auVar56._16_4_ = uVar62;
  auVar56._20_4_ = uVar62;
  auVar56._24_4_ = uVar62;
  auVar56._28_4_ = uVar62;
  auVar41 = vfmadd231ps_fma(ZEXT1632(auVar41),auVar11,auVar56);
  auVar46 = vfmadd231ps_avx512vl(auVar46,bezier_basis0._6256_32_,auVar56);
  auVar53 = vbroadcastss_avx512vl(auVar32);
  auVar37 = vfmadd231ps_fma(ZEXT1632(auVar41),auVar54,auVar53);
  auVar21 = vfmadd231ps_fma(auVar46,auVar43,auVar53);
  auVar38 = vsubps_avx(auVar63,auVar30);
  auVar41 = vsubps_avx(auVar38,(undefined1  [16])aVar1);
  auVar35 = vmulps_avx512vl(auVar26,auVar41);
  auVar41 = vshufps_avx(auVar35,auVar35,0xaa);
  auVar19._0_4_ = fVar66 * auVar41._0_4_;
  auVar19._4_4_ = fVar67 * auVar41._4_4_;
  auVar19._8_4_ = fVar68 * auVar41._8_4_;
  auVar19._12_4_ = fVar69 * auVar41._12_4_;
  auVar41 = vshufps_avx512vl(auVar35,auVar35,0x55);
  auVar41 = vfmadd231ps_avx512vl(auVar19,(undefined1  [16])aVar3,auVar41);
  auVar35._4_4_ = auVar35._0_4_;
  auVar35._8_4_ = auVar35._0_4_;
  auVar35._12_4_ = auVar35._0_4_;
  auVar35 = vfmadd231ps_fma(auVar41,(undefined1  [16])aVar2,auVar35);
  auVar41 = vsubps_avx(auVar24,auVar28);
  auVar22._0_4_ = auVar41._0_4_ * 0.33333334 + auVar38._0_4_;
  auVar22._4_4_ = auVar41._4_4_ * 0.33333334 + auVar38._4_4_;
  auVar22._8_4_ = auVar41._8_4_ * 0.33333334 + auVar38._8_4_;
  auVar22._12_4_ = auVar41._12_4_ * 0.33333334 + auVar38._12_4_;
  auVar41 = vsubps_avx(auVar22,(undefined1  [16])aVar1);
  auVar38 = vmulps_avx512vl(auVar26,auVar41);
  auVar41 = vshufps_avx(auVar38,auVar38,0xaa);
  auVar31._0_4_ = fVar66 * auVar41._0_4_;
  auVar31._4_4_ = fVar67 * auVar41._4_4_;
  auVar31._8_4_ = fVar68 * auVar41._8_4_;
  auVar31._12_4_ = fVar69 * auVar41._12_4_;
  auVar41 = vshufps_avx(auVar38,auVar38,0x55);
  auVar41 = vfmadd231ps_fma(auVar31,(undefined1  [16])aVar3,auVar41);
  auVar23._0_4_ = auVar38._0_4_;
  auVar23._4_4_ = auVar23._0_4_;
  auVar23._8_4_ = auVar23._0_4_;
  auVar23._12_4_ = auVar23._0_4_;
  auVar38 = vfmadd231ps_fma(auVar41,(undefined1  [16])aVar2,auVar23);
  auVar28 = vsubps_avx512vl(auVar25,auVar20);
  auVar41 = vsubps_avx512vl(auVar36,auVar39);
  auVar32._0_4_ = auVar41._0_4_ * 0.33333334;
  auVar32._4_4_ = auVar41._4_4_ * 0.33333334;
  auVar32._8_4_ = auVar41._8_4_ * 0.33333334;
  auVar32._12_4_ = auVar41._12_4_ * 0.33333334;
  auVar41 = vsubps_avx(auVar28,auVar32);
  auVar41 = vsubps_avx(auVar41,(undefined1  [16])aVar1);
  auVar20 = vmulps_avx512vl(auVar26,auVar41);
  auVar41 = vshufps_avx(auVar20,auVar20,0xaa);
  auVar73._0_4_ = fVar66 * auVar41._0_4_;
  auVar73._4_4_ = fVar67 * auVar41._4_4_;
  auVar73._8_4_ = fVar68 * auVar41._8_4_;
  auVar73._12_4_ = fVar69 * auVar41._12_4_;
  auVar41 = vshufps_avx512vl(auVar20,auVar20,0x55);
  auVar41 = vfmadd231ps_avx512vl(auVar73,(undefined1  [16])aVar3,auVar41);
  auVar76._0_4_ = auVar20._0_4_;
  auVar76._4_4_ = auVar76._0_4_;
  auVar76._8_4_ = auVar76._0_4_;
  auVar76._12_4_ = auVar76._0_4_;
  auVar20 = vfmadd231ps_fma(auVar41,(undefined1  [16])aVar2,auVar76);
  auVar41 = vsubps_avx(auVar28,(undefined1  [16])aVar1);
  auVar70._8_4_ = 2;
  auVar70._0_8_ = 0x200000002;
  auVar70._12_4_ = 2;
  auVar70._16_4_ = 2;
  auVar70._20_4_ = 2;
  auVar70._24_4_ = 2;
  auVar70._28_4_ = 2;
  auVar46 = vpermps_avx2(auVar70,ZEXT1632(auVar20));
  auVar28 = vmulps_avx512vl(auVar26,auVar41);
  auVar41 = vshufps_avx(auVar28,auVar28,0xaa);
  auVar39._0_4_ = fVar66 * auVar41._0_4_;
  auVar39._4_4_ = fVar67 * auVar41._4_4_;
  auVar39._8_4_ = fVar68 * auVar41._8_4_;
  auVar39._12_4_ = fVar69 * auVar41._12_4_;
  uVar62 = auVar28._0_4_;
  auVar24._4_4_ = uVar62;
  auVar24._0_4_ = uVar62;
  auVar24._8_4_ = uVar62;
  auVar24._12_4_ = uVar62;
  auVar41 = vshufps_avx(auVar28,auVar28,0x55);
  auVar41 = vfmadd231ps_fma(auVar39,(undefined1  [16])aVar3,auVar41);
  auVar41 = vfmadd231ps_fma(auVar41,(undefined1  [16])aVar2,auVar24);
  auVar43 = vpermps_avx2(auVar70,ZEXT1632(auVar41));
  auVar54 = vmulps_avx512vl(auVar43,bezier_basis0._3944_32_);
  auVar28 = vfmadd231ps_fma(auVar54,auVar58,auVar46);
  auVar43 = vmulps_avx512vl(auVar43,bezier_basis0._8568_32_);
  auVar53 = vfmadd231ps_avx512vl(auVar43,bezier_basis0._7412_32_,auVar46);
  auVar46 = vpermps_avx512vl(auVar49,ZEXT1632(auVar20));
  auVar43 = vpermps_avx512vl(auVar49,ZEXT1632(auVar41));
  auVar54 = vmulps_avx512vl(auVar43,bezier_basis0._3944_32_);
  auVar36 = vfmadd231ps_fma(auVar54,auVar58,auVar46);
  auVar43 = vmulps_avx512vl(auVar43,bezier_basis0._8568_32_);
  auVar55 = vfmadd231ps_avx512vl(auVar43,bezier_basis0._7412_32_,auVar46);
  uVar62 = auVar20._0_4_;
  auVar59._4_4_ = uVar62;
  auVar59._0_4_ = uVar62;
  auVar59._8_4_ = uVar62;
  auVar59._12_4_ = uVar62;
  auVar59._16_4_ = uVar62;
  auVar59._20_4_ = uVar62;
  auVar59._24_4_ = uVar62;
  auVar59._28_4_ = uVar62;
  auVar57._0_4_ = auVar41._0_4_;
  auVar57._4_4_ = auVar57._0_4_;
  auVar57._8_4_ = auVar57._0_4_;
  auVar57._12_4_ = auVar57._0_4_;
  auVar57._16_4_ = auVar57._0_4_;
  auVar57._20_4_ = auVar57._0_4_;
  auVar57._24_4_ = auVar57._0_4_;
  auVar57._28_4_ = auVar57._0_4_;
  auVar46 = vmulps_avx512vl(auVar57,bezier_basis0._3944_32_);
  auVar41 = vfmadd231ps_fma(auVar46,auVar59,auVar58);
  auVar46 = vmulps_avx512vl(auVar57,bezier_basis0._8568_32_);
  auVar56 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
  auVar54 = vmaxps_avx512vl(auVar56,ZEXT1632(auVar37));
  auVar57 = vbroadcastss_avx512vl(ZEXT416(0x3d638e39));
  auVar58 = vmulps_avx512vl(ZEXT1632(auVar21),auVar57);
  auVar59 = vfmadd231ps_avx512vl(auVar46,bezier_basis0._7412_32_,auVar59);
  auVar46 = vblendps_avx(auVar58,ZEXT832(0) << 0x20,1);
  auVar43 = vsubps_avx(ZEXT1632(auVar37),auVar46);
  auVar46 = vblendps_avx(auVar58,ZEXT832(0) << 0x20,0x80);
  auVar58 = vaddps_avx512vl(ZEXT1632(auVar37),auVar46);
  auVar46 = vmaxps_avx512vl(auVar43,auVar58);
  auVar60 = vmaxps_avx512vl(auVar54,auVar46);
  auVar46 = vminps_avx(auVar47,auVar48);
  auVar61 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
  auVar45 = vminps_avx512vl(auVar61,auVar45);
  auVar54 = vminps_avx(auVar45,auVar46);
  auVar46 = vminps_avx512vl(auVar51,auVar52);
  auVar45 = vminps_avx512vl(auVar61,auVar50);
  auVar50 = vminps_avx512vl(auVar45,auVar46);
  auVar46 = vminps_avx512vl(auVar43,auVar58);
  auVar43 = vminps_avx512vl(auVar61,ZEXT1632(auVar37));
  auVar58 = vminps_avx(auVar43,auVar46);
  auVar46 = vpermps_avx2(auVar70,ZEXT1632(auVar38));
  auVar43 = vfmadd231ps_avx512vl(ZEXT1632(auVar28),auVar11,auVar46);
  auVar48 = vfmadd231ps_avx512vl(auVar53,bezier_basis0._6256_32_,auVar46);
  auVar46 = vpermps_avx2(auVar70,ZEXT1632(auVar35));
  auVar47._8_8_ = bezier_basis0._484_8_;
  auVar47._0_8_ = bezier_basis0._476_8_;
  auVar47._16_8_ = bezier_basis0._492_8_;
  auVar47._24_8_ = bezier_basis0._500_8_;
  auVar20 = vfmadd231ps_fma(auVar43,auVar47,auVar46);
  auVar45._8_8_ = bezier_basis0._5108_8_;
  auVar45._0_8_ = bezier_basis0._5100_8_;
  auVar45._16_8_ = bezier_basis0._5116_8_;
  auVar45._24_8_ = bezier_basis0._5124_8_;
  auVar46 = vfmadd231ps_avx512vl(auVar48,auVar45,auVar46);
  auVar43 = vpermps_avx512vl(auVar49,ZEXT1632(auVar38));
  auVar48 = vfmadd231ps_avx512vl(ZEXT1632(auVar36),auVar11,auVar43);
  auVar51 = vfmadd231ps_avx512vl(auVar55,bezier_basis0._6256_32_,auVar43);
  auVar72._0_4_ = auVar38._0_4_;
  auVar72._4_4_ = auVar72._0_4_;
  auVar72._8_4_ = auVar72._0_4_;
  auVar72._12_4_ = auVar72._0_4_;
  auVar72._16_4_ = auVar72._0_4_;
  auVar72._20_4_ = auVar72._0_4_;
  auVar72._24_4_ = auVar72._0_4_;
  auVar72._28_4_ = auVar72._0_4_;
  auVar52 = vfmadd231ps_avx512vl(ZEXT1632(auVar41),auVar72,auVar11);
  auVar43 = vmaxps_avx512vl(auVar56,ZEXT1632(auVar20));
  auVar53 = vmulps_avx512vl(auVar46,auVar57);
  auVar55 = vfmadd231ps_avx512vl(auVar59,bezier_basis0._6256_32_,auVar72);
  auVar59 = ZEXT832(0) << 0x20;
  auVar46 = vblendps_avx(auVar53,auVar59,1);
  auVar11 = vsubps_avx(ZEXT1632(auVar20),auVar46);
  auVar46 = vblendps_avx(auVar53,auVar59,0x80);
  auVar71._0_4_ = auVar46._0_4_ + auVar20._0_4_;
  auVar71._4_4_ = auVar46._4_4_ + auVar20._4_4_;
  auVar71._8_4_ = auVar46._8_4_ + auVar20._8_4_;
  auVar71._12_4_ = auVar46._12_4_ + auVar20._12_4_;
  auVar71._16_4_ = auVar46._16_4_ + 0.0;
  auVar71._20_4_ = auVar46._20_4_ + 0.0;
  auVar71._24_4_ = auVar46._24_4_ + 0.0;
  auVar71._28_4_ = auVar46._28_4_ + 0.0;
  auVar46 = vmaxps_avx(auVar11,auVar71);
  auVar43 = vmaxps_avx(auVar43,auVar46);
  auVar46 = vpermps_avx512vl(auVar49,ZEXT1632(auVar35));
  auVar41 = vfmadd231ps_fma(auVar48,auVar47,auVar46);
  auVar46 = vfmadd231ps_avx512vl(auVar51,auVar45,auVar46);
  auVar51._0_4_ = auVar35._0_4_;
  auVar51._4_4_ = auVar51._0_4_;
  auVar51._8_4_ = auVar51._0_4_;
  auVar51._12_4_ = auVar51._0_4_;
  auVar51._16_4_ = auVar51._0_4_;
  auVar51._20_4_ = auVar51._0_4_;
  auVar51._24_4_ = auVar51._0_4_;
  auVar51._28_4_ = auVar51._0_4_;
  auVar38 = vfmadd231ps_fma(auVar52,auVar51,auVar47);
  auVar48 = vmaxps_avx512vl(auVar56,ZEXT1632(auVar41));
  auVar49 = vmulps_avx512vl(auVar46,auVar57);
  auVar51 = vfmadd231ps_avx512vl(auVar55,auVar45,auVar51);
  auVar46 = vblendps_avx(auVar49,auVar59,1);
  auVar47 = vsubps_avx(ZEXT1632(auVar41),auVar46);
  auVar46 = vblendps_avx(auVar49,auVar59,0x80);
  auVar74._0_4_ = auVar46._0_4_ + auVar41._0_4_;
  auVar74._4_4_ = auVar46._4_4_ + auVar41._4_4_;
  auVar74._8_4_ = auVar46._8_4_ + auVar41._8_4_;
  auVar74._12_4_ = auVar46._12_4_ + auVar41._12_4_;
  auVar74._16_4_ = auVar46._16_4_ + 0.0;
  auVar74._20_4_ = auVar46._20_4_ + 0.0;
  auVar74._24_4_ = auVar46._24_4_ + 0.0;
  auVar74._28_4_ = auVar46._28_4_ + 0.0;
  auVar46 = vmaxps_avx(auVar47,auVar74);
  auVar45 = vmaxps_avx(auVar48,auVar46);
  auVar49 = vmaxps_avx512vl(auVar56,ZEXT1632(auVar38));
  auVar51 = vmulps_avx512vl(auVar51,auVar57);
  auVar46 = vblendps_avx(auVar51,ZEXT832(0) << 0x20,1);
  auVar48 = vsubps_avx(ZEXT1632(auVar38),auVar46);
  auVar46 = vblendps_avx(auVar51,ZEXT832(0) << 0x20,0x80);
  auVar52._0_4_ = auVar38._0_4_ + auVar46._0_4_;
  auVar52._4_4_ = auVar38._4_4_ + auVar46._4_4_;
  auVar52._8_4_ = auVar38._8_4_ + auVar46._8_4_;
  auVar52._12_4_ = auVar38._12_4_ + auVar46._12_4_;
  auVar52._16_4_ = auVar46._16_4_ + 0.0;
  auVar52._20_4_ = auVar46._20_4_ + 0.0;
  auVar52._24_4_ = auVar46._24_4_ + 0.0;
  auVar52._28_4_ = auVar46._28_4_ + 0.0;
  auVar46 = vmaxps_avx(auVar48,auVar52);
  auVar46 = vmaxps_avx(auVar49,auVar46);
  auVar11 = vminps_avx(auVar11,auVar71);
  auVar49 = vminps_avx512vl(auVar61,ZEXT1632(auVar20));
  auVar11 = vminps_avx(auVar49,auVar11);
  auVar47 = vminps_avx(auVar47,auVar74);
  auVar49 = vminps_avx512vl(auVar61,ZEXT1632(auVar41));
  auVar47 = vminps_avx(auVar49,auVar47);
  auVar49 = vminps_avx512vl(auVar61,ZEXT1632(auVar38));
  auVar48 = vminps_avx(auVar48,auVar52);
  auVar48 = vminps_avx(auVar49,auVar48);
  auVar49 = vshufps_avx(auVar46,auVar46,0xb1);
  auVar46 = vmaxps_avx(auVar46,auVar49);
  auVar49 = vshufpd_avx(auVar46,auVar46,5);
  auVar46 = vmaxps_avx(auVar46,auVar49);
  auVar41 = vmaxps_avx(auVar46._0_16_,auVar46._16_16_);
  auVar46 = vshufps_avx(auVar45,auVar45,0xb1);
  auVar46 = vmaxps_avx(auVar45,auVar46);
  auVar45 = vshufpd_avx(auVar46,auVar46,5);
  auVar46 = vmaxps_avx(auVar46,auVar45);
  auVar38 = vmaxps_avx(auVar46._0_16_,auVar46._16_16_);
  auVar38 = vunpcklps_avx(auVar41,auVar38);
  auVar46 = vshufps_avx(auVar43,auVar43,0xb1);
  auVar46 = vmaxps_avx(auVar43,auVar46);
  auVar43 = vshufpd_avx(auVar46,auVar46,5);
  auVar46 = vmaxps_avx(auVar46,auVar43);
  auVar41 = vmaxps_avx(auVar46._0_16_,auVar46._16_16_);
  auVar41 = vinsertps_avx(auVar38,auVar41,0x28);
  auVar46 = vshufps_avx(auVar48,auVar48,0xb1);
  auVar46 = vminps_avx(auVar48,auVar46);
  auVar43 = vshufpd_avx(auVar46,auVar46,5);
  auVar46 = vminps_avx(auVar46,auVar43);
  auVar38 = vminps_avx(auVar46._0_16_,auVar46._16_16_);
  auVar46 = vshufps_avx(auVar47,auVar47,0xb1);
  auVar46 = vminps_avx(auVar47,auVar46);
  auVar43 = vshufpd_avx(auVar46,auVar46,5);
  auVar46 = vminps_avx(auVar46,auVar43);
  auVar35 = vminps_avx(auVar46._0_16_,auVar46._16_16_);
  auVar35 = vunpcklps_avx(auVar38,auVar35);
  auVar46 = vshufps_avx(auVar11,auVar11,0xb1);
  auVar46 = vminps_avx(auVar11,auVar46);
  auVar43 = vshufpd_avx(auVar46,auVar46,5);
  auVar46 = vminps_avx(auVar46,auVar43);
  auVar38 = vminps_avx(auVar46._0_16_,auVar46._16_16_);
  auVar38 = vinsertps_avx(auVar35,auVar38,0x28);
  auVar46 = vshufps_avx(auVar58,auVar58,0xb1);
  auVar46 = vminps_avx(auVar58,auVar46);
  auVar43 = vshufpd_avx(auVar46,auVar46,5);
  auVar46 = vminps_avx(auVar46,auVar43);
  auVar35 = vminps_avx(auVar46._0_16_,auVar46._16_16_);
  auVar46 = vshufps_avx(auVar50,auVar50,0xb1);
  auVar46 = vminps_avx(auVar50,auVar46);
  auVar43 = vshufpd_avx(auVar46,auVar46,5);
  auVar46 = vminps_avx(auVar46,auVar43);
  auVar20 = vminps_avx(auVar46._0_16_,auVar46._16_16_);
  auVar20 = vunpcklps_avx(auVar35,auVar20);
  auVar46 = vshufps_avx(auVar54,auVar54,0xb1);
  auVar46 = vminps_avx(auVar54,auVar46);
  auVar43 = vshufpd_avx(auVar46,auVar46,5);
  auVar46 = vminps_avx(auVar46,auVar43);
  auVar35 = vminps_avx(auVar46._0_16_,auVar46._16_16_);
  auVar35 = vinsertps_avx(auVar20,auVar35,0x28);
  auVar20 = vminps_avx(auVar38,auVar35);
  auVar46 = vshufps_avx512vl(auVar60,auVar60,0xb1);
  auVar43 = vmaxps_avx512vl(auVar60,auVar46);
  auVar46 = vshufpd_avx(auVar43,auVar43,5);
  auVar46 = vmaxps_avx(auVar43,auVar46);
  auVar38 = vmaxps_avx(auVar46._0_16_,auVar46._16_16_);
  auVar46 = vshufps_avx(auVar42,auVar42,0xb1);
  auVar46 = vmaxps_avx(auVar42,auVar46);
  auVar42 = vshufpd_avx(auVar46,auVar46,5);
  auVar46 = vmaxps_avx(auVar46,auVar42);
  auVar35 = vmaxps_avx(auVar46._0_16_,auVar46._16_16_);
  auVar35 = vunpcklps_avx(auVar38,auVar35);
  auVar46 = vshufps_avx(auVar44,auVar44,0xb1);
  auVar46 = vmaxps_avx(auVar44,auVar46);
  auVar44 = vshufpd_avx(auVar46,auVar46,5);
  auVar46 = vmaxps_avx(auVar46,auVar44);
  auVar38 = vmaxps_avx(auVar46._0_16_,auVar46._16_16_);
  auVar38 = vinsertps_avx(auVar35,auVar38,0x28);
  auVar35 = vmaxps_avx(auVar41,auVar38);
  auVar36._8_4_ = 0x7fffffff;
  auVar36._0_8_ = 0x7fffffff7fffffff;
  auVar36._12_4_ = 0x7fffffff;
  auVar41 = vandps_avx(auVar20,auVar36);
  auVar38 = vandps_avx(auVar35,auVar36);
  auVar41 = vmaxps_avx(auVar41,auVar38);
  auVar38 = vmovshdup_avx(auVar41);
  auVar38 = vmaxss_avx(auVar38,auVar41);
  auVar41 = vshufpd_avx(auVar41,auVar41,1);
  auVar41 = vmaxss_avx(auVar41,auVar38);
  fVar65 = auVar41._0_4_ * 4.7683716e-07;
  auVar41._4_4_ = fVar65;
  auVar41._0_4_ = fVar65;
  auVar41._8_4_ = fVar65;
  auVar41._12_4_ = fVar65;
  aVar1 = (anon_union_16_2_47237d3f_for_Vec3fa_0)vsubps_avx(auVar20,auVar41);
  (__return_storage_ptr__->lower).field_0 = aVar1;
  (__return_storage_ptr__->upper).field_0.m128[0] = auVar35._0_4_ + fVar65;
  (__return_storage_ptr__->upper).field_0.m128[1] = auVar35._4_4_ + fVar65;
  (__return_storage_ptr__->upper).field_0.m128[2] = auVar35._8_4_ + fVar65;
  (__return_storage_ptr__->upper).field_0.m128[3] = auVar35._12_4_ + fVar65;
  return __return_storage_ptr__;
}

Assistant:

size_t CurveGeometry::getGeometryDataDeviceByteSize() const {
    size_t byte_size = sizeof(CurveGeometry);
    if (vertices.size() > 0)
      byte_size += numTimeSteps * sizeof(BufferView<Vec3ff>);
    if (normals.size() > 0)
      byte_size += numTimeSteps * sizeof(BufferView<Vec3fa>);
    if (tangents.size() > 0)
      byte_size += numTimeSteps * sizeof(BufferView<Vec3ff>);
    if (dnormals.size() > 0)
      byte_size += numTimeSteps * sizeof(BufferView<Vec3fa>);
    return 16 * ((byte_size + 15) / 16);
  }